

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Detonation_PDU::Decode(Detonation_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  Descriptor *pDVar3;
  MunitionDescriptor *pMVar4;
  ExplosionDescriptor *this_01;
  ArticulatedPart *this_02;
  AttachedPart *this_03;
  VariableParameter *this_04;
  int iVar5;
  long local_190;
  long local_160;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_128;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_110;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_f8;
  KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> local_e0;
  VariableParameter *local_c8;
  VariableParameter *p;
  undefined1 local_b8 [3];
  KUINT8 paramTyp;
  KUINT16 pos;
  KUINT8 i;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_a0;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_88;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_70;
  undefined1 local_55;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Detonation_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar5 = 0;
  if ((local_19 & 1) != 0) {
    iVar5 = 0xc;
  }
  if ((uint)KVar1 + iVar5 < 0x68) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::clear(&this->m_vVariableParameters);
  Warfare_Header::Decode(&this->super_Warfare_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_Velocity).super_DataTypeBase);
  DATA_TYPE::operator>>(pKVar2,&(this->m_LocationWorldCoords).super_DataTypeBase);
  if ((this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion < 7) {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if (pDVar3 == (Descriptor *)0x0) {
      pMVar4 = (MunitionDescriptor *)operator_new(0x20);
      DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar4);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_70,(Descriptor *)pMVar4);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_70);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_70);
    }
  }
  else if (((this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 3) == 0) {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if (pDVar3 != (Descriptor *)0x0) {
      pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
      if (pDVar3 == (Descriptor *)0x0) {
        local_160 = 0;
      }
      else {
        local_160 = __dynamic_cast(pDVar3,&DATA_TYPE::Descriptor::typeinfo,
                                   &DATA_TYPE::MunitionDescriptor::typeinfo,0);
      }
      if (local_160 != 0) goto LAB_001e0426;
    }
    pMVar4 = (MunitionDescriptor *)operator_new(0x20);
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor(pMVar4);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_88,(Descriptor *)pMVar4);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_88);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_88);
  }
  else if (((this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 3) == 1) {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if ((pDVar3 == (Descriptor *)0x0) ||
       (pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor),
       pDVar3 == (Descriptor *)0x0)) {
      pDVar3 = (Descriptor *)operator_new(0x18);
      DATA_TYPE::Descriptor::Descriptor(pDVar3);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_a0,pDVar3);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,&local_a0);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_a0);
    }
  }
  else {
    pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
    if (pDVar3 != (Descriptor *)0x0) {
      pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
      if (pDVar3 == (Descriptor *)0x0) {
        local_190 = 0;
      }
      else {
        local_190 = __dynamic_cast(pDVar3,&DATA_TYPE::Descriptor::typeinfo,
                                   &DATA_TYPE::ExplosionDescriptor::typeinfo,0);
      }
      if (local_190 != 0) goto LAB_001e0426;
    }
    this_01 = (ExplosionDescriptor *)operator_new(0x20);
    DATA_TYPE::ExplosionDescriptor::ExplosionDescriptor(this_01);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)local_b8,(Descriptor *)this_01);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=
              (&this->m_pDescriptor,(KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)local_b8);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr
              ((KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)local_b8);
  }
LAB_001e0426:
  pDVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator->(&this->m_pDescriptor);
  (*(pDVar3->super_DataTypeBase)._vptr_DataTypeBase[3])(pDVar3,pKStack_18);
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,&(this->m_LocationEntityCoords).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8DetonationResult);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumOfVariableParams);
  KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  for (p._7_1_ = 0; p._7_1_ < this->m_ui8NumOfVariableParams; p._7_1_ = p._7_1_ + 1) {
    p._4_2_ = KDataStream::GetCurrentWritePosition(pKStack_18);
    KDataStream::operator>>(pKStack_18,(uchar *)((long)&p + 3));
    KDataStream::SetCurrentWritePosition(pKStack_18,p._4_2_);
    local_c8 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                         ((uint)p._3_1_,pKStack_18);
    if (local_c8 == (VariableParameter *)0x0) {
      if (p._3_1_ == 0) {
        this_02 = (ArticulatedPart *)operator_new(0x28);
        DATA_TYPE::ArticulatedPart::ArticulatedPart(this_02,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr
                  (&local_f8,(VariableParameter *)this_02);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
        ::push_back(&this->m_vVariableParameters,&local_f8);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_f8);
      }
      else if (p._3_1_ == 1) {
        this_03 = (AttachedPart *)operator_new(0x30);
        DATA_TYPE::AttachedPart::AttachedPart(this_03,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr
                  (&local_110,(VariableParameter *)this_03);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
        ::push_back(&this->m_vVariableParameters,&local_110);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_110);
      }
      else {
        this_04 = (VariableParameter *)operator_new(0x18);
        DATA_TYPE::VariableParameter::VariableParameter(this_04,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr(&local_128,this_04);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
        ::push_back(&this->m_vVariableParameters,&local_128);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_128);
      }
    }
    else {
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::KRef_Ptr(&local_e0,local_c8);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
      ::push_back(&this->m_vVariableParameters,&local_e0);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::~KRef_Ptr(&local_e0);
    }
  }
  return;
}

Assistant:

void Detonation_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DETONATION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Warfare_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_LocationWorldCoords;

    #if DIS_VERSION < 7

    if( !m_pDescriptor.GetPtr() )
    {
        m_pDescriptor = DescPtr( new MunitionDescriptor() );
    }

    #else

    // If the protocol version is not 7 then treat it as a MunitionDesc
    if( m_ui8ProtocolVersion < 7 )
    {
        if( !m_pDescriptor.GetPtr() )
        {
            m_pDescriptor = DescPtr( new MunitionDescriptor() );
        }
    }
    else // DIS 7
    {
        if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == MunitionDTI ) // Munition
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new MunitionDescriptor() );
            }
        }
        else if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == ExpendableDTI ) // Expendable
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExpendableDescriptor() );
            }
        }
        else // Explosion
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExplosionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExplosionDescriptor() );
            }
        }
    }
    #endif

    m_pDescriptor->Decode( stream );

    stream >> KDIS_STREAM m_LocationEntityCoords
           >> m_ui8DetonationResult
           >> m_ui8NumOfVariableParams
           >> m_ui16Padding1;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}